

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  FILE *__stream;
  char *__s;
  int local_15c;
  regex_t re;
  regmatch_t subs [10];
  char erbuf [100];
  
  progname = *argv;
  local_15c = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              iVar2 = getopt(argc,argv,"c:e:S:E:x");
              if (iVar2 != 0x45) break;
              iVar2 = atoi(_optarg);
              endoff = (regoff_t)iVar2;
            }
            if (iVar2 != 0x53) break;
            iVar2 = atoi(_optarg);
            startoff = (regoff_t)iVar2;
          }
          if (iVar2 != 99) break;
          copts = options(99,_optarg);
        }
        if (iVar2 != 0x65) break;
        eopts = options(0x65,_optarg);
      }
      if (iVar2 != 0x78) break;
      debug = debug + 1;
    }
    if (iVar2 == -1) break;
    local_15c = local_15c + 1;
  }
  if (local_15c != 0) {
    fprintf(_stderr,"usage: %s ",progname);
    fwrite("[-c copt][-C][-d] [re]\n",0x17,1,_stderr);
    exit(2);
  }
  lVar3 = (long)_optind;
  if (argc <= _optind) {
    regress(_stdin);
    goto LAB_001035ad;
  }
  _optind = _optind + 1;
  iVar2 = regcomp((regex_t *)&re,argv[lVar3],copts);
  if (iVar2 == 0) {
    regprint(&re,_stdout);
    iVar2 = eopts;
    if (argc <= _optind) {
      regfree((regex_t *)&re);
      goto LAB_001035ad;
    }
    if ((eopts & 4U) == 0) {
      __s = argv[_optind];
    }
    else {
      subs[0].rm_so = startoff;
      __s = argv[_optind];
      sVar4 = strlen(__s);
      subs[0].rm_eo = sVar4 - endoff;
    }
    iVar2 = regexec((regex_t *)&re,__s,10,(regmatch_t *)subs,iVar2);
    if (iVar2 == 0) {
      if ((copts & 4U) == 0) {
        if (subs[0].rm_so != -1) {
          if ((int)subs[0].rm_eo == (int)subs[0].rm_so) {
            printf("match `\'@%.1s\n",argv[_optind] + subs[0].rm_so);
          }
          else {
            printf("match `%.*s\'\n");
          }
        }
        uVar6 = 1;
        for (lVar3 = 0x18; lVar3 != 0xa8; lVar3 = lVar3 + 0x10) {
          lVar1 = *(long *)((long)subs + lVar3 + -8);
          if (lVar1 != -1) {
            printf("(%d) `%.*s\'\n",(ulong)uVar6,
                   (ulong)(uint)(*(int *)((long)&subs[0].rm_so + lVar3) - (int)lVar1),
                   argv[_optind] + lVar1);
          }
          uVar6 = uVar6 + 1;
        }
      }
      goto LAB_001035ad;
    }
    uVar5 = regerror(iVar2,(regex_t *)&re,erbuf,100);
    __stream = _stderr;
    eprint(iVar2);
  }
  else {
    uVar5 = regerror(iVar2,(regex_t *)&re,erbuf,100);
    __stream = _stderr;
    eprint(iVar2);
  }
  fprintf(__stream,"error %s, %d/%d `%s\'\n",eprint::epbuf,uVar5 & 0xffffffff,100,erbuf);
LAB_001035ad:
  exit(status);
}

Assistant:

int main(argc, argv)
int argc;
char *argv[];
{
	regex_t re;
#	define	NS	10
	regmatch_t subs[NS];
	char erbuf[100];
	int err;
	size_t len;
	int c;
	int errflg = 0;
	register int i;
	extern int optind;
	extern char *optarg;

	progname = argv[0];

	while ((c = getopt(argc, argv, "c:e:S:E:x")) != EOF)
		switch (c) {
		case 'c':	/* compile options */
			copts = options('c', optarg);
			break;
		case 'e':	/* execute options */
			eopts = options('e', optarg);
			break;
		case 'S':	/* start offset */
			startoff = (regoff_t)atoi(optarg);
			break;
		case 'E':	/* end offset */
			endoff = (regoff_t)atoi(optarg);
			break;
		case 'x':	/* Debugging. */
			debug++;
			break;
		case '?':
		default:
			errflg++;
			break;
		}
	if (errflg) {
		fprintf(stderr, "usage: %s ", progname);
		fprintf(stderr, "[-c copt][-C][-d] [re]\n");
		exit(2);
	}

	if (optind >= argc) {
		regress(stdin);
		exit(status);
	}

	err = regcomp(&re, argv[optind++], copts);
	if (err) {
		len = regerror(err, &re, erbuf, sizeof(erbuf));
		fprintf(stderr, "error %s, %d/%d `%s'\n",
			eprint(err), (int)len, (int)sizeof(erbuf), erbuf);
		exit(status);
	}
	regprint(&re, stdout);	

	if (optind >= argc) {
		regfree(&re);
		exit(status);
	}

	if (eopts&REG_STARTEND) {
		subs[0].rm_so = startoff;
		subs[0].rm_eo = strlen(argv[optind]) - endoff;
	}
	err = regexec(&re, argv[optind], (size_t)NS, subs, eopts);
	if (err) {
		len = regerror(err, &re, erbuf, sizeof(erbuf));
		fprintf(stderr, "error %s, %d/%d `%s'\n",
			eprint(err), (int)len, (int)sizeof(erbuf), erbuf);
		exit(status);
	}
	if (!(copts&REG_NOSUB)) {
		len = (int)(subs[0].rm_eo - subs[0].rm_so);
		if (subs[0].rm_so != -1) {
			if (len != 0)
				printf("match `%.*s'\n", (int)len,
					argv[optind] + subs[0].rm_so);
			else
				printf("match `'@%.1s\n",
					argv[optind] + subs[0].rm_so);
		}
		for (i = 1; i < NS; i++)
			if (subs[i].rm_so != -1)
				printf("(%d) `%.*s'\n", i,
					(int)(subs[i].rm_eo - subs[i].rm_so),
					argv[optind] + subs[i].rm_so);
	}
	exit(status);
}